

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
::internal_emplace<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
          (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
           *this,iterator iter,FileEntry *args)

{
  btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  field_type i;
  int *piVar4;
  key_compare *pkVar5;
  iterator iVar6;
  FileCompare local_80;
  int local_74 [2];
  undefined1 local_69;
  undefined1 auStack_68 [7];
  bool replaced_node;
  anon_class_24_3_6b874288 replace_leaf_root_node;
  anon_class_8_1_a7a39255 transfer_and_delete;
  allocator_type *alloc;
  field_type max_count;
  FileEntry *args_local;
  btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *this_local;
  iterator iter_local;
  
  this_local = (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                *)iter.node_;
  iter_local.node_._0_4_ = iter.position_;
  bVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::is_internal((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                         *)this_local);
  if (bVar1) {
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
    ::operator--((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                  *)&this_local);
    iter_local.node_._0_4_ = (int)iter_local.node_ + 1;
  }
  bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::max_count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                       *)this_local);
  transfer_and_delete.alloc = (allocator_type **)mutable_allocator(this);
  replace_leaf_root_node.transfer_and_delete = &transfer_and_delete;
  _auStack_68 = (iterator *)&this_local;
  replace_leaf_root_node.this =
       (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
        *)&replace_leaf_root_node.transfer_and_delete;
  local_69 = 0;
  replace_leaf_root_node.iter = (iterator *)this;
  bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::count((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   *)this_local);
  if (bVar3 == bVar2) {
    if (bVar2 < 6) {
      local_74[1] = 6;
      local_74[0] = (uint)bVar2 << 1;
      piVar4 = std::min<int>(local_74 + 1,local_74);
      internal_emplace<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::
      anon_class_24_3_6b874288::operator()
                ((anon_class_24_3_6b874288 *)auStack_68,(field_type)*piVar4);
      local_69 = 1;
    }
    else {
      rebalance_or_split(this,(iterator *)&this_local);
    }
  }
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  ::emplace_value<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
            ((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
              *)this_local,(field_type)(int)iter_local.node_,
             (allocator_type *)transfer_and_delete.alloc,args);
  this_00 = this_local;
  i = (field_type)(int)iter_local.node_;
  pkVar5 = key_comp(this);
  local_80.index =
       (pkVar5->
       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
       ).super_FileCompare.index;
  bVar1 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::
          is_ordered_correctly<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                    ((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                      *)this_00,i,&local_80);
  if (bVar1) {
    this->size_ = this->size_ + 1;
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
    ::update_generation((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
                         *)&this_local);
    iVar6.position_ = (int)iter_local.node_;
    iVar6.node_ = (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                   *)this_local;
    iVar6._12_4_ = 0;
    return iVar6;
  }
  __assert_fail("iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_), original_key_compare(key_comp())) && \"If this assert fails, then either (1) the comparator may violate \" \"transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see \" \"https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a \" \"key may have been mutated after it was inserted into the tree.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                ,0xb42,
                "iterator absl::container_internal::btree<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>, Args = <google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&...args)
    -> iterator {
  if (iter.node_->is_internal()) {
    // We can't insert on an internal node. Instead, we'll insert after the
    // previous value which is guaranteed to be on a leaf node.
    --iter;
    ++iter.position_;
  }
  const field_type max_count = iter.node_->max_count();
  allocator_type *alloc = mutable_allocator();

  const auto transfer_and_delete = [&](node_type *old_node,
                                       node_type *new_node) {
    new_node->transfer_n(old_node->count(), new_node->start(),
                         old_node->start(), old_node, alloc);
    new_node->set_finish(old_node->finish());
    old_node->set_finish(old_node->start());
    new_node->set_generation(old_node->generation());
    node_type::clear_and_delete(old_node, alloc);
  };
  const auto replace_leaf_root_node = [&](field_type new_node_size) {
    assert(iter.node_ == root());
    node_type *old_root = iter.node_;
    node_type *new_root = iter.node_ = new_leaf_root_node(new_node_size);
    transfer_and_delete(old_root, new_root);
    mutable_root() = mutable_rightmost() = new_root;
  };

  bool replaced_node = false;
  if (iter.node_->count() == max_count) {
    // Make room in the leaf for the new item.
    if (max_count < kNodeSlots) {
      // Insertion into the root where the root is smaller than the full node
      // size. Simply grow the size of the root node.
      replace_leaf_root_node(static_cast<field_type>(
          (std::min)(static_cast<int>(kNodeSlots), 2 * max_count)));
      replaced_node = true;
    } else {
      rebalance_or_split(&iter);
    }
  }
  (void)replaced_node;
#if defined(ABSL_HAVE_ADDRESS_SANITIZER) || \
    defined(ABSL_HAVE_HWADDRESS_SANITIZER)
  if (!replaced_node) {
    assert(iter.node_->is_leaf());
    if (iter.node_->is_root()) {
      replace_leaf_root_node(max_count);
    } else {
      node_type *old_node = iter.node_;
      const bool was_rightmost = rightmost() == old_node;
      const bool was_leftmost = leftmost() == old_node;
      node_type *parent = old_node->parent();
      const field_type position = old_node->position();
      node_type *new_node = iter.node_ = new_leaf_node(position, parent);
      parent->set_child_noupdate_position(position, new_node);
      transfer_and_delete(old_node, new_node);
      if (was_rightmost) mutable_rightmost() = new_node;
      // The leftmost node is stored as the parent of the root node.
      if (was_leftmost) root()->set_parent(new_node);
    }
  }
#endif
  iter.node_->emplace_value(static_cast<field_type>(iter.position_), alloc,
                            std::forward<Args>(args)...);
  assert(
      iter.node_->is_ordered_correctly(static_cast<field_type>(iter.position_),
                                       original_key_compare(key_comp())) &&
      "If this assert fails, then either (1) the comparator may violate "
      "transitivity, i.e. comp(a,b) && comp(b,c) -> comp(a,c) (see "
      "https://en.cppreference.com/w/cpp/named_req/Compare), or (2) a "
      "key may have been mutated after it was inserted into the tree.");
  ++size_;
  iter.update_generation();
  return iter;
}